

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_PackedFields_Test::TestBody
          (DynamicMessageTest_PackedFields_Test *this)

{
  ParamType *pPVar1;
  MessageLite *pMVar2;
  ThreadSafeArena *arena_00;
  ReflectionTester reflection_tester;
  Arena arena;
  ReflectionTester local_140;
  ThreadSafeArena local_c0;
  
  internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  pMVar2 = &((this->super_DynamicMessageTest).packed_prototype_)->super_MessageLite;
  pPVar1 = testing::WithParamInterface<std::tuple<bool,_bool>_>::GetParam();
  arena_00 = (ThreadSafeArena *)0x0;
  if ((pPVar1->super__Tuple_impl<0UL,_bool,_bool>).super__Head_base<0UL,_bool,_false>._M_head_impl
      != false) {
    arena_00 = &local_c0;
  }
  pMVar2 = MessageLite::New(pMVar2,(Arena *)arena_00);
  TestUtil::ReflectionTester::ReflectionTester
            (&local_140,(this->super_DynamicMessageTest).packed_descriptor_);
  TestUtil::ReflectionTester::SetPackedFieldsViaReflection(&local_140,(Message *)pMVar2);
  TestUtil::ReflectionTester::ExpectPackedFieldsSetViaReflection(&local_140,(Message *)pMVar2);
  pPVar1 = testing::WithParamInterface<std::tuple<bool,_bool>_>::GetParam();
  if ((pPVar1->super__Tuple_impl<0UL,_bool,_bool>).super__Head_base<0UL,_bool,_false>._M_head_impl
      == false) {
    (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  }
  internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, PackedFields) {
  // Check that packed fields work properly.
  Arena arena;
  Message* message = packed_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(packed_descriptor_);

  reflection_tester.SetPackedFieldsViaReflection(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}